

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ODDataBarExpandedReader.cpp
# Opt level: O2

Pair * ZXing::OneD::ReadPair(Pair *__return_storage_ptr__,PatternView *view,Direction dir)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  Character CVar4;
  Character CVar5;
  long lVar6;
  byte bVar7;
  array<ZXing::FixedPattern<5,_15,_false>,_6UL> *patterns;
  ulong uVar8;
  uint finder_00;
  float modSizeRef;
  int finder;
  undefined1 local_d8 [16];
  Iterator local_c8;
  Iterator puStack_c0;
  value_type avStack_b8 [8];
  undefined1 auStack_a8 [16];
  PatternView local_98;
  undefined1 local_78 [16];
  Iterator local_68;
  Iterator puStack_60;
  value_type local_58 [8];
  undefined1 auStack_48 [24];
  
  local_98._data = view->_data + 8;
  local_98._size = 5;
  local_98._base = view->_base;
  local_98._end = view->_end;
  auStack_a8._0_2_ = 2;
  auStack_a8._2_2_ = 1;
  auStack_a8._4_8_ = 0x2000200090001;
  avStack_b8[0] = 1;
  avStack_b8[1] = 8;
  avStack_b8[2] = 2;
  avStack_b8[3] = 3;
  avStack_b8[4] = 1;
  avStack_b8[5] = 1;
  avStack_b8[6] = 5;
  avStack_b8[7] = 6;
  local_c8 = (Iterator)0x1000100030006;
  puStack_c0 = (Iterator)0x1000300040006;
  local_d8._0_8_ = 0x8000400010001;
  local_d8._8_8_ = 0x4000100010001;
  local_78._0_8_ = 0x1000400080001;
  local_78._8_8_ = 0x4000600030001;
  local_68 = (Iterator)0x4000300010001;
  puStack_60 = (Iterator)0x3000100010006;
  local_58[0] = 2;
  local_58[1] = 8;
  local_58[2] = 1;
  local_58[3] = 1;
  local_58[4] = 2;
  local_58[5] = 6;
  local_58[6] = 5;
  local_58[7] = 1;
  auStack_48._0_2_ = 1;
  auStack_48._2_2_ = 2;
  auStack_48._4_8_ = 0x1000100090002;
  patterns = (array<ZXing::FixedPattern<5,_15,_false>,_6UL> *)local_78;
  if (dir == Left) {
    patterns = (array<ZXing::FixedPattern<5,_15,_false>,_6UL> *)local_d8;
  }
  uVar2 = RowReader::DecodeDigit<ZXing::PatternView,std::array<ZXing::FixedPattern<5,15,false>,6ul>>
                    (&local_98,patterns,0.2,0.45,true);
  finder_00 = ~uVar2;
  if (dir != Left) {
    finder_00 = uVar2 + 1;
  }
  if (finder_00 == 0) goto LAB_00172e0b;
  local_d8._0_8_ = view->_data;
  local_d8._8_4_ = 8;
  local_c8 = view->_base;
  puStack_c0 = view->_end;
  finder = finder_00;
  CVar4 = ReadDataCharacter((PatternView *)local_d8,finder_00,false);
  iVar3 = CVar4.value;
  if ((iVar3 == -1) ||
     ((finder_00 == 1 &&
      ((iVar3 < -0x1a5 ||
       (9 < ((int)((long)((ulong)(uint)(iVar3 >> 0x1f) << 0x20 | (ulong)CVar4 & 0xffffffff) / 0xd3)
            + 5) / 2 - 2U)))))) goto LAB_00172e0b;
  local_d8._0_8_ = view->_data + 0xd;
  local_d8._8_4_ = 8;
  local_c8 = view->_base;
  puStack_c0 = view->_end;
  bVar1 = PatternView::isValid((PatternView *)local_d8);
  if (bVar1) {
    local_78._0_8_ = view->_data + 0xd;
    local_78._8_4_ = 8;
    local_68 = view->_base;
    puStack_60 = view->_end;
    modSizeRef = DataBar::ModSizeFinder(view);
    bVar1 = DataBar::IsCharacter((PatternView *)local_78,0x11,modSizeRef);
    if (!bVar1) goto LAB_00172d82;
    local_98._data = view->_data + 0xd;
    local_98._size = 8;
    local_98._base = view->_base;
    local_98._end = view->_end;
    CVar5 = ReadDataCharacter(&local_98,finder_00,true);
    uVar8 = (ulong)CVar5 >> 0x20;
    if (CVar5.value != -1) {
      bVar7 = 1;
      goto LAB_00172da6;
    }
  }
  else {
LAB_00172d82:
    uVar8 = 0;
  }
  bVar1 = Contains<std::array<int,7ul>,int>((array<int,_7UL> *)VALID_HALF_PAIRS,&finder);
  if (bVar1) {
    CVar5.value = -1;
    CVar5.checksum = 0;
    bVar7 = 0;
    finder_00 = finder;
LAB_00172da6:
    __return_storage_ptr__->left = CVar4;
    __return_storage_ptr__->right = (Character)((ulong)CVar5 & 0xffffffff | uVar8 << 0x20);
    __return_storage_ptr__->finder = finder_00;
    iVar3 = PatternView::pixelsInFront(view);
    __return_storage_ptr__->xStart = iVar3;
    lVar6 = 0x10;
    if (bVar7 != 0) {
      lVar6 = 0x1a;
    }
    local_d8._0_8_ = lVar6 + (long)view->_data;
    local_d8._8_4_ = (uint)bVar7 * 3 + 5;
    local_c8 = view->_base;
    puStack_c0 = view->_end;
    iVar3 = PatternView::pixelsTillEnd((PatternView *)local_d8);
    __return_storage_ptr__->xStop = iVar3;
    __return_storage_ptr__->y = -1;
    __return_storage_ptr__->count = 1;
    return __return_storage_ptr__;
  }
LAB_00172e0b:
  (__return_storage_ptr__->left).value = -1;
  (__return_storage_ptr__->left).checksum = 0;
  (__return_storage_ptr__->right).value = -1;
  (__return_storage_ptr__->right).checksum = 0;
  __return_storage_ptr__->finder = 0;
  __return_storage_ptr__->xStart = -1;
  __return_storage_ptr__->xStop = 1;
  __return_storage_ptr__->y = -1;
  __return_storage_ptr__->count = 1;
  return __return_storage_ptr__;
}

Assistant:

static Pair ReadPair(const PatternView& view, Direction dir)
{
	if (int finder = ParseFinderPattern(Finder(view), dir))
		if (auto charL = ReadDataCharacter(LeftChar(view), finder, false))
			if (finder != FINDER_A || ChecksumIsValid(charL)) {
				auto charR = RightChar(view).isValid() && IsCharacter(RightChar(view), 17, ModSizeFinder(view))
								 ? ReadDataCharacter(RightChar(view), finder, true)
								 : Character();
				if (charR || Contains(VALID_HALF_PAIRS, finder))
					return {charL, charR, finder, view.pixelsInFront(),
							(charR ? RightChar(view) : Finder(view)).pixelsTillEnd()};
			}

	return {};
}